

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

lua_Number luaL_checknumber(lua_State *L,int idx)

{
  TValue TVar1;
  int iVar2;
  TValue in_RAX;
  TValue *pTVar3;
  TValue tmp;
  TValue local_18;
  
  local_18 = in_RAX;
  pTVar3 = index2adr(L,idx);
  TVar1 = (TValue)pTVar3->n;
  if ((0xfffffffffffffff2 < (ulong)(TVar1.it64 >> 0x2f)) &&
     ((TVar1.it64 >> 0x2f != 0xfffffffffffffffb ||
      (iVar2 = lj_strscan_num((GCstr *)(TVar1.u64 & 0x7fffffffffff),&local_18), TVar1 = local_18,
      iVar2 == 0)))) {
    lj_err_argt(L,idx,3);
  }
  return TVar1.n;
}

Assistant:

LUALIB_API lua_Number luaL_checknumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (!(tvisstr(o) && lj_strscan_num(strV(o), &tmp)))
    lj_err_argt(L, idx, LUA_TNUMBER);
  return numV(&tmp);
}